

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

integer_type * __thiscall
toml::basic_value<toml::type_config>::as_integer(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == integer) {
    return (integer_type *)&this->field_1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_integer()",&local_31);
  throw_bad_cast(this,&local_30,integer);
}

Assistant:

integer_type& as_integer()
    {
        if(this->type_ != value_t::integer)
        {
            this->throw_bad_cast("toml::value::as_integer()", value_t::integer);
        }
        return this->integer_.value;
    }